

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

string * __thiscall
leveldb::Version::DebugString_abi_cxx11_(string *__return_storage_ptr__,Version *this)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar1;
  uint64_t num;
  size_t i;
  ulong uVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (num = 0; num != 7; num = num + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    AppendNumberTo(__return_storage_ptr__,num);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pvVar1 = this->files_ + num;
    for (uVar2 = 0;
        uVar2 < (ulong)((long)(pvVar1->
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar1->
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      AppendNumberTo(__return_storage_ptr__,
                     (pvVar1->
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar2]->number);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      AppendNumberTo(__return_storage_ptr__,
                     (pvVar1->
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar2]->file_size);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      InternalKey::DebugString_abi_cxx11_
                (&local_50,
                 &(pvVar1->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar2]->smallest);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      InternalKey::DebugString_abi_cxx11_
                (&local_50,
                 &(pvVar1->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar2]->largest);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Version::DebugString() const {
  std::string r;
  for (int level = 0; level < config::kNumLevels; level++) {
    // E.g.,
    //   --- level 1 ---
    //   17:123['a' .. 'd']
    //   20:43['e' .. 'g']
    r.append("--- level ");
    AppendNumberTo(&r, level);
    r.append(" ---\n");
    const std::vector<FileMetaData*>& files = files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      r.push_back(' ');
      AppendNumberTo(&r, files[i]->number);
      r.push_back(':');
      AppendNumberTo(&r, files[i]->file_size);
      r.append("[");
      r.append(files[i]->smallest.DebugString());
      r.append(" .. ");
      r.append(files[i]->largest.DebugString());
      r.append("]\n");
    }
  }
  return r;
}